

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

void __thiscall
JsUtil::
BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_JsUtil::CharacterBuffer<char16_t>,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_JsUtil::CharacterBuffer<char16_t>,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
         *this)

{
  uint uVar1;
  undefined8 uVar2;
  uint size;
  Type TVar3;
  int iVar4;
  hash_t hVar5;
  uint uVar6;
  EntryType *dst;
  long lVar7;
  long lVar8;
  int *piVar9;
  undefined8 local_68;
  undefined4 local_60;
  BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_JsUtil::CharacterBuffer<char16_t>,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *local_58;
  uint local_4c;
  Type local_48;
  int *newBuckets;
  Type local_34;
  
  uVar1 = this->count;
  size = uVar1 * 2;
  local_34 = 4;
  if ((8 < size) && (local_34 = uVar1 & 0x7fffffff, (uVar1 - 1 & local_34) != 0)) {
    iVar4 = 0x1f;
    if (local_34 != 0) {
      for (; local_34 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    local_34 = 1 << (-((byte)iVar4 ^ 0x1f) & 0x1f);
  }
  local_48.ptr = (int *)0x0;
  newBuckets = (int *)0x0;
  if (local_34 == this->bucketCount) {
    dst = AllocateEntries(this,size,true);
    Memory::
    CopyArray<JsUtil::SimpleHashedEntry<JsUtil::CharacterBuffer<char16_t>,JsUtil::CharacterBuffer<char16_t>>,JsUtil::CharacterBuffer<char16_t>,Memory::Recycler>
              (dst,(long)(int)size,(this->entries).ptr,(long)this->count);
    DeleteEntries(this,(this->entries).ptr,this->size);
    Memory::Recycler::WBSetBit((char *)&this->entries);
    (this->entries).ptr = dst;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->entries);
    this->size = size;
    this->modFunctionIndex = 0x4b;
  }
  else {
    Allocate(this,&local_48.ptr,(EntryType **)&newBuckets,local_34,size);
    local_4c = size;
    Memory::
    CopyArray<JsUtil::SimpleHashedEntry<JsUtil::CharacterBuffer<char16_t>,JsUtil::CharacterBuffer<char16_t>>,JsUtil::CharacterBuffer<char16_t>,Memory::Recycler>
              ((SimpleHashedEntry<JsUtil::CharacterBuffer<char16_t>,_JsUtil::CharacterBuffer<char16_t>_>
                *)newBuckets,(long)(int)size,(this->entries).ptr,(long)this->count);
    this->modFunctionIndex = 0x4b;
    iVar4 = this->count;
    if (0 < iVar4) {
      lVar7 = 0x10;
      lVar8 = 0;
      piVar9 = newBuckets;
      local_58 = this;
      do {
        if (-2 < *(int *)((long)piVar9 + lVar7)) {
          uVar2 = *(undefined8 *)((long)piVar9 + lVar7 + -0x10);
          Memory::Recycler::WBSetBit((char *)&local_68);
          local_68 = uVar2;
          Memory::RecyclerWriteBarrierManager::WriteBarrier((CharacterBuffer *)&local_68);
          this = local_58;
          local_60 = *(undefined4 *)((long)piVar9 + lVar7 + -8);
          hVar5 = CharacterBuffer::operator_cast_to_unsigned_int((CharacterBuffer *)&local_68);
          uVar6 = GetBucket(hVar5 * 2 + 1,local_34,this->modFunctionIndex);
          *(int *)((long)newBuckets + lVar7) = local_48.ptr[(int)uVar6];
          local_48.ptr[(int)uVar6] = (int)lVar8;
          iVar4 = this->count;
          piVar9 = newBuckets;
        }
        lVar8 = lVar8 + 1;
        lVar7 = lVar7 + 0x18;
      } while (lVar8 < iVar4);
    }
    DeleteBuckets(this,(this->buckets).ptr,this->bucketCount);
    DeleteEntries(this,(this->entries).ptr,this->size);
    uVar1 = local_4c;
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,local_4c,local_4c - this->size);
    }
    TVar3.ptr = local_48.ptr;
    Memory::Recycler::WBSetBit((char *)this);
    (this->buckets).ptr = TVar3.ptr;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
    piVar9 = newBuckets;
    Memory::Recycler::WBSetBit((char *)&this->entries);
    (this->entries).ptr =
         (SimpleHashedEntry<JsUtil::CharacterBuffer<char16_t>,_JsUtil::CharacterBuffer<char16_t>_> *
         )piVar9;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->entries);
    this->bucketCount = local_34;
    this->size = uVar1;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }